

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void __thiscall
pybind11::arg_v::arg_v<char_const(&)[8]>(arg_v *this,arg *base,char (*x) [8],char *descr)

{
  undefined8 uVar1;
  handle local_38;
  PyObject *local_30;
  char *local_28;
  char *descr_local;
  char (*x_local) [8];
  arg *base_local;
  arg_v *this_local;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  local_38.m_ptr = (PyObject *)0x0;
  local_28 = descr;
  descr_local = *x;
  x_local = (char (*) [8])base;
  base_local = &this->super_arg;
  handle::handle(&local_38);
  local_30 = (PyObject *)detail::type_caster<char,_void>::cast(*x,automatic,local_38);
  reinterpret_steal<pybind11::object>((pybind11 *)&this->value,(handle)local_30);
  this->descr = local_28;
  type_id<char_const(&)[8]>();
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    { }